

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauMerge.c
# Opt level: O2

void Dau_DsdMergeSubstitute_rec
               (Dau_Sto_t *pS,char *pStr,char **p,int *pMatches,int *pStatus,int fWrite)

{
  char **ppcVar1;
  char cVar2;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  char **ppcVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  char *pcVar13;
  char **ppcVar14;
  
  pbVar10 = (byte *)*p;
  if (*pbVar10 == 0x21) {
    if (fWrite != 0) {
      pcVar13 = pS->pPosOutput;
      pS->pPosOutput = pcVar13 + 1;
      *pcVar13 = '!';
      pbVar10 = (byte *)*p;
    }
    pbVar10 = pbVar10 + 1;
    *p = (char *)pbVar10;
  }
  ppcVar1 = &pS->pPosOutput;
  while (bVar5 = *pbVar10, (byte)(bVar5 + 0xbf) < 6 || (byte)(bVar5 - 0x30) < 10) {
    if (fWrite != 0) {
      pbVar10 = (byte *)*ppcVar1;
      *ppcVar1 = (char *)(pbVar10 + 1);
      *pbVar10 = bVar5;
      pbVar10 = (byte *)*p;
    }
    pbVar10 = pbVar10 + 1;
    *p = (char *)pbVar10;
  }
  if ((bVar5 == 0x3c) && (pStr[(long)pMatches[(long)pbVar10 - (long)pStr] + 1] == '{')) {
    pbVar11 = (byte *)(pStr + (long)pMatches[(long)pbVar10 - (long)pStr] + 1);
    *p = (char *)pbVar11;
    if (fWrite == 0) {
      bVar5 = *pbVar11;
      pbVar10 = pbVar11;
      if ((byte)(bVar5 + 0x9f) < 0x1a) {
        return;
      }
      goto LAB_00435657;
    }
    for (; pbVar10 < pbVar11; pbVar10 = pbVar10 + 1) {
      bVar5 = *pbVar10;
      pbVar3 = (byte *)*ppcVar1;
      *ppcVar1 = (char *)(pbVar3 + 1);
      *pbVar3 = bVar5;
    }
    pbVar10 = (byte *)*p;
  }
  bVar5 = *pbVar10;
  if ((byte)(bVar5 + 0x9f) < 0x1a) {
    if (fWrite == 0) {
      return;
    }
    pbVar10 = (byte *)*ppcVar1;
    *ppcVar1 = (char *)(pbVar10 + 1);
    *pbVar10 = bVar5;
    return;
  }
LAB_00435657:
  uVar9 = (uint)bVar5;
  if (((0x3f < bVar5 - 0x3c) || ((0x8000000080000001U >> ((ulong)(bVar5 - 0x3c) & 0x3f) & 1) == 0))
     && (uVar9 != 0x28)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x1ec,
                  "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                 );
  }
  if ((bVar5 != 0x28) + uVar9 + 1 != (int)pStr[pMatches[(long)pbVar10 - (long)pStr]]) {
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                  ,0x19f,
                  "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                 );
  }
  iVar6 = pStatus[(long)pbVar10 - (long)pStr];
  pcVar13 = pStr + pMatches[(long)pbVar10 - (long)pStr];
  if (fWrite == 0) {
    if (iVar6 != 3) {
      __assert_fail("Status == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x1a2,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
    *p = pcVar13;
  }
  else if (iVar6 == 0) {
    pbVar10 = (byte *)*ppcVar1;
    *ppcVar1 = (char *)(pbVar10 + 1);
    *pbVar10 = bVar5;
    while( true ) {
      pcVar4 = *p;
      pcVar12 = pcVar4 + 1;
      *p = pcVar12;
      cVar2 = pcVar4[1];
      if (pcVar13 <= pcVar12) break;
      if (cVar2 == '!') {
        pcVar12 = *ppcVar1;
        *ppcVar1 = pcVar12 + 1;
        *pcVar12 = '!';
        *p = *p + 1;
      }
      Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,1);
    }
    pcVar12 = *ppcVar1;
    *ppcVar1 = pcVar12 + 1;
    *pcVar12 = cVar2;
    if (*p != pcVar13) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x1b4,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
  }
  else {
    if (iVar6 != 1) {
      if (iVar6 == 3) {
        __assert_fail("Status != 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x1a6,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
      if ((bVar5 != 0x7b) && (uVar9 != 0x3c)) {
        if (iVar6 == 2) {
          pbVar10 = (byte *)pS->pPosOutput;
          pS->pPosOutput = (char *)(pbVar10 + 1);
          *pbVar10 = bVar5;
          cVar2 = **p;
          iVar6 = pS->iVarUsed;
          ppcVar14 = pS->pPosStore + iVar6;
          *ppcVar14 = pS->pStore[iVar6];
          if (cVar2 != '\0') {
            *ppcVar14 = pS->pStore[iVar6] + 1;
            pS->pStore[iVar6][0] = cVar2;
          }
          pS->iVarUsed = iVar6 + 1;
          while( true ) {
            pcVar4 = *p;
            pcVar12 = pcVar4 + 1;
            *p = pcVar12;
            if (pcVar13 <= pcVar12) break;
            iVar7 = Dau_DsdMergeGetStatus(pcVar12,pStr,pMatches,pStatus);
            if (*pcVar12 == '!') {
              ppcVar8 = ppcVar1;
              if (iVar7 == 3) {
                ppcVar8 = ppcVar14;
              }
              pcVar12 = *ppcVar8;
              *ppcVar8 = pcVar12 + 1;
              *pcVar12 = '!';
              *p = *p + 1;
              pcVar12 = pcVar4 + 2;
            }
            Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar7 != 3));
            if (iVar7 == 3) {
              Dau_DsdMergeStoreAddToDef(pS,iVar6,pcVar12,*p + 1);
            }
          }
          cVar2 = *pcVar13;
          if (cVar2 != '\0') {
            pcVar13 = *ppcVar14;
            *ppcVar14 = pcVar13 + 1;
            *pcVar13 = cVar2;
          }
          pcVar13 = *ppcVar14;
          *ppcVar14 = pcVar13 + 1;
          *pcVar13 = '\0';
          pcVar13 = *ppcVar1;
          *ppcVar1 = pcVar13 + 1;
          *pcVar13 = (char)iVar6 + 'a';
          cVar2 = **p;
          pcVar13 = *ppcVar1;
          *ppcVar1 = pcVar13 + 1;
          *pcVar13 = cVar2;
          return;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                      ,0x1e9,
                      "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                     );
      }
    }
    pbVar10 = (byte *)pS->pPosOutput;
    pS->pPosOutput = (char *)(pbVar10 + 1);
    *pbVar10 = bVar5;
    while( true ) {
      pcVar4 = *p;
      pcVar12 = pcVar4 + 1;
      *p = pcVar12;
      cVar2 = pcVar4[1];
      if (pcVar13 <= pcVar12) break;
      if (cVar2 == '!') {
        pcVar12 = *ppcVar1;
        *ppcVar1 = pcVar12 + 1;
        *pcVar12 = '!';
        pcVar12 = *p + 1;
        *p = pcVar12;
      }
      iVar6 = Dau_DsdMergeGetStatus(pcVar12,pStr,pMatches,pStatus);
      Dau_DsdMergeSubstitute_rec(pS,pStr,p,pMatches,pStatus,(uint)(iVar6 != 3));
      if (iVar6 == 3) {
        pcVar4 = *p;
        iVar6 = pS->iVarUsed;
        pS->pPosStore[iVar6] = pS->pStore[iVar6];
        pS->iVarUsed = iVar6 + 1;
        Dau_DsdMergeStoreAddToDef(pS,iVar6,pcVar12,pcVar4 + 1);
        pcVar12 = pS->pPosStore[iVar6];
        pS->pPosStore[iVar6] = pcVar12 + 1;
        *pcVar12 = '\0';
        pcVar12 = pS->pPosOutput;
        pS->pPosOutput = pcVar12 + 1;
        *pcVar12 = (char)iVar6 + 'a';
      }
    }
    pcVar12 = *ppcVar1;
    *ppcVar1 = pcVar12 + 1;
    *pcVar12 = cVar2;
    if (*p != pcVar13) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauMerge.c"
                    ,0x1cb,
                    "void Dau_DsdMergeSubstitute_rec(Dau_Sto_t *, char *, char **, int *, int *, int)"
                   );
    }
  }
  return;
}

Assistant:

void Dau_DsdMergeSubstitute_rec( Dau_Sto_t * pS, char * pStr, char ** p, int * pMatches, int * pStatus, int fWrite )
{
//    assert( **p != '!' );

    if ( **p == '!' )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }

    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        (*p)++;
    }
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[ *p - pStr ];
        if ( *(q+1) == '{' )
        {
            char * pTemp = *p;
            *p = q+1;
            if ( fWrite )
                for ( ; pTemp < q+1; pTemp++ )
                    Dau_DsdMergeStoreAddToOutputChar( pS, *pTemp );
        }
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        if ( fWrite )
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
        return;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int New, StatusFan, Status = pStatus[*p - pStr];
        char * pBeg, * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( !fWrite )
        {
             assert( Status == 3 );
             *p = q;
             return;
        }
        assert( Status != 3 );
        if ( Status == 0 ) // none pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, 1 );
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 1 || **p == '<' || **p == '{' ) // 1 pure
        {
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                if ( **p == '!' )
                {
                    Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    (*p)++;
                }
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                {
                    int New = Dau_DsdMergeStoreCreateDef( pS, pBeg, *p+1 );
                    Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
                }
            }
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            assert( *p == q );
            return;
        }
        if ( Status == 2 )
        {
            // add more than one defs
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            New = Dau_DsdMergeStoreStartDef( pS, **p );
            for ( (*p)++; *p < q; (*p)++ )
            {
                pBeg = *p;
                StatusFan = Dau_DsdMergeGetStatus( pBeg, pStr, pMatches, pStatus );
                if ( **p == '!' )
                {
                    if ( StatusFan != 3 )
                        Dau_DsdMergeStoreAddToOutputChar( pS, '!' );
                    else
                        Dau_DsdMergeStoreAddToDefChar( pS, New, '!' );
                    (*p)++;
                    pBeg++;
                }
                Dau_DsdMergeSubstitute_rec( pS, pStr, p, pMatches, pStatus, StatusFan != 3 );
                if ( StatusFan == 3 )
                    Dau_DsdMergeStoreAddToDef( pS, New, pBeg, *p+1 );
            }
            Dau_DsdMergeStoreStopDef( pS, New, *q );
            Dau_DsdMergeStoreAddToOutputChar( pS, (char)('a' + New) );
            Dau_DsdMergeStoreAddToOutputChar( pS, **p );
            return;
        }
        assert( 0 );
        return;
    }
    assert( 0 );
}